

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls_method.cc
# Opt level: O2

bool __thiscall
bssl::tls_set_write_state
          (bssl *this,SSL *ssl,ssl_encryption_level_t level,UniquePtr<SSLAEADContext> *aead_ctx,
          Span<const_unsigned_char> traffic_secret)

{
  bool bVar1;
  int iVar2;
  undefined4 in_register_00000014;
  long lVar3;
  
  bVar1 = tls_flush_pending_hs_data((SSL *)this);
  if (bVar1) {
    iVar2 = SSL_is_quic((SSL *)this);
    lVar3 = *(long *)(this + 0x30);
    if (iVar2 != 0) {
      if (((*(long *)(lVar3 + 0x118) == 0) ||
          ((*(byte *)(*(long *)(lVar3 + 0x118) + 0x6ca) & 0x10) == 0)) &&
         (iVar2 = (**(code **)(*(long *)(this + 0x98) + 8))
                            (this,(ulong)ssl & 0xffffffff,
                             ((((__uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter> *)
                               CONCAT44(in_register_00000014,level))->_M_t).
                              super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>
                              .super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl)->
                             cipher_,aead_ctx,traffic_secret.data_), iVar2 == 0)) goto LAB_0016412d;
      if ((int)ssl == 1) {
        return true;
      }
      lVar3 = *(long *)(this + 0x30);
      *(int *)(lVar3 + 0xcc) = (int)ssl;
    }
    *(undefined8 *)(lVar3 + 8) = 0;
    std::__uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>::operator=
              ((__uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter> *)(lVar3 + 0x110),
               (__uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter> *)
               CONCAT44(in_register_00000014,level));
    bVar1 = true;
  }
  else {
LAB_0016412d:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

static bool tls_set_write_state(SSL *ssl, ssl_encryption_level_t level,
                                UniquePtr<SSLAEADContext> aead_ctx,
                                Span<const uint8_t> traffic_secret) {
  if (!tls_flush_pending_hs_data(ssl)) {
    return false;
  }

  if (SSL_is_quic(ssl)) {
    if ((ssl->s3->hs == nullptr || !ssl->s3->hs->hints_requested) &&
        !ssl->quic_method->set_write_secret(ssl, level, aead_ctx->cipher(),
                                            traffic_secret.data(),
                                            traffic_secret.size())) {
      return false;
    }

    // QUIC only uses |ssl| for handshake messages, which never use early data
    // keys, so we return without installing anything. This avoids needing to
    // have two secrets active at once in 0-RTT.
    if (level == ssl_encryption_early_data) {
      return true;
    }
    ssl->s3->quic_write_level = level;
  }

  ssl->s3->write_sequence = 0;
  ssl->s3->aead_write_ctx = std::move(aead_ctx);
  return true;
}